

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiWindow::ImGuiWindow(ImGuiWindow *this,ImGuiContext *context,char *name)

{
  int *piVar1;
  int iVar2;
  uint *puVar3;
  ImGuiID IVar4;
  char *pcVar5;
  size_t sVar6;
  uint *__dest;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar13 [16];
  undefined8 uVar12;
  undefined8 uVar14;
  
  (this->DC).Indent = 0.0;
  (this->DC).ColumnsOffset = 0.0;
  (this->DC).GroupOffset.x = 0.0;
  (this->DC).ChildWindows.Size = 0;
  (this->DC).ChildWindows.Capacity = 0;
  (this->DC).ChildWindows.Data = (ImGuiWindow **)0x0;
  auVar9 = ZEXT816(0) << 0x40;
  auVar11 = ZEXT1632(auVar9);
  uVar12 = SUB168(auVar11._0_16_,0);
  uVar14 = SUB168(auVar11._0_16_,8);
  (this->DC).LastItemRect.Min.x = (float)(int)uVar12;
  (this->DC).LastItemRect.Min.y = (float)(int)((ulong)uVar12 >> 0x20);
  (this->DC).LastItemRect.Max.x = (float)(int)uVar14;
  (this->DC).LastItemRect.Max.y = (float)(int)((ulong)uVar14 >> 0x20);
  uVar12 = SUB168(auVar11._16_16_,0);
  uVar14 = SUB168(auVar11._16_16_,8);
  (this->DC).LastItemDisplayRect.Min.x = (float)(int)uVar12;
  (this->DC).LastItemDisplayRect.Min.y = (float)(int)((ulong)uVar12 >> 0x20);
  (this->DC).LastItemDisplayRect.Max.x = (float)(int)uVar14;
  (this->DC).LastItemDisplayRect.Max.y = (float)(int)((ulong)uVar14 >> 0x20);
  (this->DC).MenuBarOffset.x = (float)(int)auVar11._0_8_;
  (this->DC).MenuBarOffset.y = (float)(int)((ulong)auVar11._0_8_ >> 0x20);
  (this->DC).MenuColumns.Spacing = (float)auVar11._8_4_;
  (this->DC).MenuColumns.Width = (float)auVar11._12_4_;
  (this->DC).MenuColumns.NextWidth = (float)auVar11._16_4_;
  (this->DC).MenuColumns.Pos[0] = (float)auVar11._20_4_;
  (this->DC).MenuColumns.Pos[1] = (float)auVar11._24_4_;
  (this->DC).MenuColumns.Pos[2] = (float)auVar11._28_4_;
  auVar11 = ZEXT1632(auVar9);
  (this->DC).MenuColumns.Width = (float)auVar11._0_4_;
  (this->DC).MenuColumns.NextWidth = (float)auVar11._4_4_;
  (this->DC).MenuColumns.Pos[0] = (float)auVar11._8_4_;
  (this->DC).MenuColumns.Pos[1] = (float)auVar11._12_4_;
  (this->DC).MenuColumns.Pos[2] = (float)auVar11._16_4_;
  (this->DC).MenuColumns.NextWidths[0] = (float)auVar11._20_4_;
  (this->DC).MenuColumns.NextWidths[1] = (float)auVar11._24_4_;
  (this->DC).MenuColumns.NextWidths[2] = (float)auVar11._28_4_;
  auVar10 = auVar11._0_16_;
  auVar13 = auVar11._16_16_;
  (this->DC).ItemWidthStack.Size = auVar10._0_4_;
  (this->DC).ItemWidthStack.Capacity = auVar10._4_4_;
  (this->DC).ItemWidthStack.Data = (float *)auVar10._8_8_;
  (this->DC).TextWrapPosStack.Size = auVar13._0_4_;
  (this->DC).TextWrapPosStack.Capacity = auVar13._4_4_;
  (this->DC).TextWrapPosStack.Data = (float *)auVar13._8_8_;
  *(undefined1 (*) [32])((long)&(this->DC).ItemWidthStack.Data + 6) = auVar11;
  *(undefined1 (*) [32])this->NavRectRel = auVar11;
  auVar11 = ZEXT1632(auVar9);
  (this->Pos).x = (float)(int)auVar11._0_8_;
  (this->Pos).y = (float)(int)((ulong)auVar11._0_8_ >> 0x20);
  (this->Size).x = (float)(int)auVar11._8_8_;
  (this->Size).y = (float)(int)((ulong)auVar11._8_8_ >> 0x20);
  (this->SizeFull).x = (float)(int)auVar11._16_8_;
  (this->SizeFull).y = (float)(int)((ulong)auVar11._16_8_ >> 0x20);
  (this->ContentSize).x = (float)(int)auVar11._24_8_;
  (this->ContentSize).y = (float)(int)((ulong)auVar11._24_8_ >> 0x20);
  (this->ContentSize).x = (float)(int)auVar11._0_8_;
  (this->ContentSize).y = (float)(int)((ulong)auVar11._0_8_ >> 0x20);
  (this->ContentSizeIdeal).x = (float)(int)auVar11._8_8_;
  (this->ContentSizeIdeal).y = (float)(int)((ulong)auVar11._8_8_ >> 0x20);
  (this->ContentSizeExplicit).x = (float)(int)auVar11._16_8_;
  (this->ContentSizeExplicit).y = (float)(int)((ulong)auVar11._16_8_ >> 0x20);
  (this->WindowPadding).x = (float)(int)auVar11._24_8_;
  (this->WindowPadding).y = (float)(int)((ulong)auVar11._24_8_ >> 0x20);
  (this->Scroll).x = (float)(int)auVar11._0_8_;
  (this->Scroll).y = (float)(int)((ulong)auVar11._0_8_ >> 0x20);
  (this->ScrollMax).x = (float)(int)auVar11._8_8_;
  (this->ScrollMax).y = (float)(int)((ulong)auVar11._8_8_ >> 0x20);
  (this->ScrollTarget).x = (float)(int)auVar11._16_8_;
  (this->ScrollTarget).y = (float)(int)((ulong)auVar11._16_8_ >> 0x20);
  (this->ScrollTargetCenterRatio).x = (float)(int)auVar11._24_8_;
  (this->ScrollTargetCenterRatio).y = (float)(int)((ulong)auVar11._24_8_ >> 0x20);
  (this->ScrollTarget).x = (float)(int)auVar11._0_8_;
  (this->ScrollTarget).y = (float)(int)((ulong)auVar11._0_8_ >> 0x20);
  (this->ScrollTargetCenterRatio).x = (float)(int)auVar11._8_8_;
  (this->ScrollTargetCenterRatio).y = (float)(int)((ulong)auVar11._8_8_ >> 0x20);
  (this->ScrollTargetEdgeSnapDist).x = (float)(int)auVar11._16_8_;
  (this->ScrollTargetEdgeSnapDist).y = (float)(int)((ulong)auVar11._16_8_ >> 0x20);
  (this->ScrollbarSizes).x = (float)(int)auVar11._24_8_;
  (this->ScrollbarSizes).y = (float)(int)((ulong)auVar11._24_8_ >> 0x20);
  (this->SetWindowPosVal).x = 0.0;
  (this->SetWindowPosVal).y = 0.0;
  (this->SetWindowPosPivot).x = 0.0;
  (this->SetWindowPosPivot).y = 0.0;
  auVar10 = auVar11._0_16_;
  (this->IDStack).Size = auVar10._0_4_;
  (this->IDStack).Capacity = auVar10._4_4_;
  (this->IDStack).Data = (uint *)auVar10._8_8_;
  (this->DC).CursorPos.x = (float)(int)auVar11._16_8_;
  (this->DC).CursorPos.y = (float)(int)((ulong)auVar11._16_8_ >> 0x20);
  (this->DC).CursorPosPrevLine.x = (float)(int)auVar11._24_8_;
  (this->DC).CursorPosPrevLine.y = (float)(int)((ulong)auVar11._24_8_ >> 0x20);
  (this->DC).CursorStartPos.x = (float)(int)auVar11._0_8_;
  (this->DC).CursorStartPos.y = (float)(int)((ulong)auVar11._0_8_ >> 0x20);
  (this->DC).CursorMaxPos.x = (float)(int)auVar11._8_8_;
  (this->DC).CursorMaxPos.y = (float)(int)((ulong)auVar11._8_8_ >> 0x20);
  (this->DC).IdealMaxPos.x = (float)(int)auVar11._16_8_;
  (this->DC).IdealMaxPos.y = (float)(int)((ulong)auVar11._16_8_ >> 0x20);
  (this->DC).CurrLineSize.x = (float)(int)auVar11._24_8_;
  (this->DC).CurrLineSize.y = (float)(int)((ulong)auVar11._24_8_ >> 0x20);
  (this->DC).PrevLineSize.x = 0.0;
  (this->DC).PrevLineSize.y = 0.0;
  *(undefined1 (*) [32])&(this->ClipRect).Max = auVar11;
  uVar12 = SUB168(auVar11._0_16_,0);
  uVar14 = SUB168(auVar11._0_16_,8);
  (this->ParentWorkRect).Min.x = (float)(int)uVar12;
  (this->ParentWorkRect).Min.y = (float)(int)((ulong)uVar12 >> 0x20);
  (this->ParentWorkRect).Max.x = (float)(int)uVar14;
  (this->ParentWorkRect).Max.y = (float)(int)((ulong)uVar14 >> 0x20);
  uVar12 = SUB168(auVar11._16_16_,0);
  uVar14 = SUB168(auVar11._16_16_,8);
  (this->ClipRect).Min.x = (float)(int)uVar12;
  (this->ClipRect).Min.y = (float)(int)((ulong)uVar12 >> 0x20);
  (this->ClipRect).Max.x = (float)(int)uVar14;
  (this->ClipRect).Max.y = (float)(int)((ulong)uVar14 >> 0x20);
  auVar11 = ZEXT1632(auVar9);
  uVar12 = SUB168(auVar11._0_16_,0);
  uVar14 = SUB168(auVar11._0_16_,8);
  (this->InnerClipRect).Min.x = (float)(int)uVar12;
  (this->InnerClipRect).Min.y = (float)(int)((ulong)uVar12 >> 0x20);
  (this->InnerClipRect).Max.x = (float)(int)uVar14;
  (this->InnerClipRect).Max.y = (float)(int)((ulong)uVar14 >> 0x20);
  uVar12 = SUB168(auVar11._16_16_,0);
  uVar14 = SUB168(auVar11._16_16_,8);
  (this->WorkRect).Min.x = (float)(int)uVar12;
  (this->WorkRect).Min.y = (float)(int)((ulong)uVar12 >> 0x20);
  (this->WorkRect).Max.x = (float)(int)uVar14;
  (this->WorkRect).Max.y = (float)(int)((ulong)uVar14 >> 0x20);
  uVar12 = SUB168(auVar11._0_16_,0);
  uVar14 = SUB168(auVar11._0_16_,8);
  (this->OuterRectClipped).Min.x = (float)(int)uVar12;
  (this->OuterRectClipped).Min.y = (float)(int)((ulong)uVar12 >> 0x20);
  (this->OuterRectClipped).Max.x = (float)(int)uVar14;
  (this->OuterRectClipped).Max.y = (float)(int)((ulong)uVar14 >> 0x20);
  uVar12 = SUB168(auVar11._16_16_,0);
  uVar14 = SUB168(auVar11._16_16_,8);
  (this->InnerRect).Min.x = (float)(int)uVar12;
  (this->InnerRect).Min.y = (float)(int)((ulong)uVar12 >> 0x20);
  (this->InnerRect).Max.x = (float)(int)uVar14;
  (this->InnerRect).Max.y = (float)(int)((ulong)uVar14 >> 0x20);
  auVar9 = auVar11._16_16_;
  this->StateStorage = (ImGuiStorage)auVar11._0_16_;
  (this->ColumnsStorage).Size = auVar9._0_4_;
  (this->ColumnsStorage).Capacity = auVar9._4_4_;
  (this->ColumnsStorage).Data = (ImGuiOldColumns *)auVar9._8_8_;
  auVar9 = auVar11._0_16_;
  auVar10 = auVar11._16_16_;
  (this->DrawListInst).CmdBuffer.Size = auVar9._0_4_;
  (this->DrawListInst).CmdBuffer.Capacity = auVar9._4_4_;
  (this->DrawListInst).CmdBuffer.Data = (ImDrawCmd *)auVar9._8_8_;
  (this->DrawListInst).IdxBuffer.Size = auVar10._0_4_;
  (this->DrawListInst).IdxBuffer.Capacity = auVar10._4_4_;
  (this->DrawListInst).IdxBuffer.Data = (unsigned_short *)auVar10._8_8_;
  auVar9 = auVar11._0_16_;
  (this->DrawListInst).VtxBuffer.Size = auVar9._0_4_;
  (this->DrawListInst).VtxBuffer.Capacity = auVar9._4_4_;
  (this->DrawListInst).VtxBuffer.Data = (ImDrawVert *)auVar9._8_8_;
  (this->DrawListInst).Flags = auVar11._16_4_;
  (this->DrawListInst)._VtxCurrentIdx = auVar11._20_4_;
  (this->DrawListInst)._Data = (ImDrawListSharedData *)auVar11._24_8_;
  (this->DrawListInst)._OwnerName = (char *)auVar11._0_8_;
  (this->DrawListInst)._VtxWritePtr = (ImDrawVert *)auVar11._8_8_;
  (this->DrawListInst)._IdxWritePtr = (ImDrawIdx *)auVar11._16_8_;
  (this->DrawListInst)._ClipRectStack.Size = auVar11._24_4_;
  (this->DrawListInst)._ClipRectStack.Capacity = auVar11._28_4_;
  *(undefined1 (*) [32])&(this->DrawListInst)._ClipRectStack.Data = auVar11;
  *(undefined1 (*) [32])&(this->DrawListInst)._Path.Data = auVar11;
  *(undefined1 (*) [32])&(this->DrawListInst)._CmdHeader.VtxOffset = auVar11;
  *(undefined8 *)&(this->DrawListInst)._FringeScale = 0;
  memset(this,0,1000);
  pcVar5 = ImStrdup(name);
  this->Name = pcVar5;
  sVar6 = strlen(name);
  this->NameBufLen = (int)sVar6 + 1;
  IVar4 = ImHashStr(name,0,0);
  this->ID = IVar4;
  iVar8 = (this->IDStack).Size;
  iVar2 = (this->IDStack).Capacity;
  if (iVar8 == iVar2) {
    iVar8 = iVar8 + 1;
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar8 < iVar7) {
      iVar8 = iVar7;
    }
    if (iVar2 < iVar8) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar8 << 2,GImAllocatorUserData);
      puVar3 = (this->IDStack).Data;
      if (puVar3 != (uint *)0x0) {
        memcpy(__dest,puVar3,(long)(this->IDStack).Size << 2);
        puVar3 = (this->IDStack).Data;
        if ((puVar3 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar3,GImAllocatorUserData);
      }
      (this->IDStack).Data = __dest;
      (this->IDStack).Capacity = iVar8;
    }
  }
  (this->IDStack).Data[(this->IDStack).Size] = this->ID;
  (this->IDStack).Size = (this->IDStack).Size + 1;
  IVar4 = GetID(this,"#MOVE",(char *)0x0);
  this->MoveId = IVar4;
  (this->ScrollTarget).x = 3.4028235e+38;
  (this->ScrollTarget).y = 3.4028235e+38;
  (this->ScrollTargetCenterRatio).x = 0.5;
  (this->ScrollTargetCenterRatio).y = 0.5;
  this->AutoFitFramesX = -1;
  this->AutoFitFramesY = -1;
  this->AutoPosLastDirection = -1;
  *(uint *)&this->field_0xaf = (uint)(byte)this->field_0xb2 << 0x18 | 0xf0f0f;
  (this->SetWindowPosVal).x = 3.4028235e+38;
  (this->SetWindowPosVal).y = 3.4028235e+38;
  (this->SetWindowPosPivot).x = 3.4028235e+38;
  (this->SetWindowPosPivot).y = 3.4028235e+38;
  this->LastFrameActive = -1;
  this->LastTimeActive = -1.0;
  this->FontWindowScale = 1.0;
  this->SettingsOffset = -1;
  this->DrawList = &this->DrawListInst;
  (this->DrawListInst)._Data = &context->DrawListSharedData;
  (this->DrawListInst)._OwnerName = this->Name;
  return;
}

Assistant:

ImGuiWindow::ImGuiWindow(ImGuiContext* context, const char* name) : DrawListInst(NULL)
{
    memset(this, 0, sizeof(*this));
    Name = ImStrdup(name);
    NameBufLen = (int)strlen(name) + 1;
    ID = ImHashStr(name);
    IDStack.push_back(ID);
    MoveId = GetID("#MOVE");
    ScrollTarget = ImVec2(FLT_MAX, FLT_MAX);
    ScrollTargetCenterRatio = ImVec2(0.5f, 0.5f);
    AutoFitFramesX = AutoFitFramesY = -1;
    AutoPosLastDirection = ImGuiDir_None;
    SetWindowPosAllowFlags = SetWindowSizeAllowFlags = SetWindowCollapsedAllowFlags = ImGuiCond_Always | ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing;
    SetWindowPosVal = SetWindowPosPivot = ImVec2(FLT_MAX, FLT_MAX);
    LastFrameActive = -1;
    LastTimeActive = -1.0f;
    FontWindowScale = 1.0f;
    SettingsOffset = -1;
    DrawList = &DrawListInst;
    DrawList->_Data = &context->DrawListSharedData;
    DrawList->_OwnerName = Name;
}